

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

UChar * __thiscall icu_63::LocDataParser::nextString(LocDataParser *this)

{
  wchar16 wVar1;
  wchar16 wVar2;
  wchar16 wVar3;
  UBool UVar4;
  wchar16 wVar5;
  wchar16 *pwVar6;
  wchar16 *pwVar7;
  char *in_RSI;
  wchar16 *pwVar8;
  wchar16 *pwVar9;
  
  pwVar6 = this->e;
  pwVar9 = this->p;
  if (pwVar9 < pwVar6) {
    wVar5 = this->ch;
    do {
      if (wVar5 == L'\xffff') {
        wVar5 = *pwVar9;
      }
      UVar4 = PatternProps::isWhiteSpace((uint)(ushort)wVar5);
      pwVar6 = this->e;
      pwVar9 = this->p;
      if (UVar4 == '\0') break;
      pwVar9 = pwVar9 + 1;
      this->p = pwVar9;
      this->ch = L'\xffff';
      wVar5 = L'\xffff';
    } while (pwVar9 < pwVar6);
  }
  if (pwVar9 < pwVar6) {
    wVar5 = *pwVar9;
    if ((wVar5 == L'\'') || (wVar5 == L'\"')) {
      pwVar9 = pwVar9 + 1;
      this->p = pwVar9;
      this->ch = L'\xffff';
      pwVar8 = L"\'";
      if (wVar5 == L'\"') {
        pwVar8 = L"\"";
      }
    }
    else {
      pwVar8 = L" ,><\'\"";
    }
    pwVar7 = pwVar9;
    if (pwVar9 < pwVar6) {
      wVar1 = *pwVar8;
      do {
        wVar2 = *pwVar7;
        pwVar6 = pwVar8;
        if ((wVar1 == L' ') &&
           (UVar4 = PatternProps::isWhiteSpace((uint)(ushort)wVar2), UVar4 != '\0')) {
          pwVar7 = this->p;
          break;
        }
        do {
          wVar3 = *pwVar6;
          if (wVar3 == L'\0') break;
          pwVar6 = pwVar6 + 1;
        } while (wVar3 != wVar2);
        pwVar7 = this->p;
        if (wVar3 == wVar2) break;
        pwVar7 = pwVar7 + 1;
        this->p = pwVar7;
      } while (pwVar7 < this->e);
      pwVar6 = this->e;
    }
    if (pwVar7 != pwVar6) {
      wVar1 = *pwVar7;
      if (pwVar9 < pwVar7) {
        this->ch = wVar1;
        *pwVar7 = L'\0';
        pwVar6 = pwVar9;
      }
      else {
        pwVar6 = (wchar16 *)0x0;
      }
      if ((wVar5 == L'\'') || (wVar5 == L'\"')) {
        if ((wVar1 == wVar5) && (pwVar7 != pwVar9)) {
          this->p = pwVar7 + 1;
          this->ch = L'\xffff';
          return pwVar6;
        }
      }
      else {
        if (0x3c < (ushort)wVar1) {
          return pwVar6;
        }
        if ((0x1000008400000000U >> ((ulong)(uint)(ushort)wVar1 & 0x3f) & 1) == 0) {
          return pwVar6;
        }
      }
    }
    parseError(this,in_RSI);
  }
  return (UChar *)0x0;
}

Assistant:

UChar*
LocDataParser::nextString() {
    UChar* result = NULL;
    
    skipWhitespace();
    if (p < e) {
        const UChar* terminators;
        UChar c = *p;
        UBool haveQuote = c == QUOTE || c == TICK;
        if (haveQuote) {
            inc();
            terminators = c == QUOTE ? DQUOTE_STOPLIST : SQUOTE_STOPLIST;
        } else {
            terminators = NOQUOTE_STOPLIST;
        }
        UChar* start = p;
        while (p < e && !inList(*p, terminators)) ++p;
        if (p == e) {
            ERROR("Unexpected end of data");
        }
        
        UChar x = *p;
        if (p > start) {
            ch = x;
            *p = 0x0; // terminate by writing to data
            result = start; // just point into data
        }
        if (haveQuote) {
            if (x != c) {
                ERROR("Missing matching quote");
            } else if (p == start) {
                ERROR("Empty string");
            }
            inc();
        } else if (x == OPEN_ANGLE || x == TICK || x == QUOTE) {
            ERROR("Unexpected character in string");
        }
    }

    // ok for there to be no next string
    return result;
}